

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O3

void __thiscall
icu_63::IndianCalendar::handleComputeFields
          (IndianCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int32_t iVar11;
  int iVar12;
  double dVar13;
  
  dVar2 = uprv_floor_63((double)julianDay + -0.5);
  dVar2 = dVar2 + 0.5;
  dVar3 = uprv_floor_63((dVar2 + -1721425.5) / 146097.0);
  dVar4 = uprv_floor_63(dVar2 + -1721425.5);
  dVar13 = uprv_floor_63((double)((int)dVar4 % 0x23ab1) / 36524.0);
  dVar4 = uprv_floor_63((double)((int)dVar4 % 0x23ab1));
  dVar5 = uprv_floor_63((double)((int)dVar4 % 0x8eac) / 1461.0);
  dVar4 = uprv_floor_63((double)((int)dVar4 % 0x8eac));
  dVar4 = uprv_floor_63((double)((int)dVar4 % 0x5b5) / 365.0);
  uVar10 = (int)(dVar5 * 4.0 + dVar3 * 400.0 + dVar13 * 100.0 + dVar4) +
           (uint)(dVar13 != 4.0 && dVar4 != 4.0);
  dVar3 = gregorianToJD(uVar10,1,1);
  dVar4 = gregorianToJD(uVar10,3,1);
  dVar13 = 0.0;
  if ((dVar4 <= dVar2) &&
     (((uVar10 & 3) != 0 ||
      ((dVar13 = 1.0, (uVar10 * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar10 * 0x40000000) < 0x28f5c29 &&
       ((int)uVar10 % 400 != 0)))))) {
    dVar13 = 2.0;
  }
  dVar2 = uprv_floor_63((((dVar2 - dVar3) + dVar13) * 12.0 + 373.0) / 367.0);
  gregorianToJD(uVar10,(int)dVar2,1);
  dVar2 = gregorianToJD(uVar10,1,1);
  iVar12 = (int)((double)julianDay - dVar2);
  if (iVar12 < 0x50) {
    uVar1 = uVar10 - 1;
    if (((uVar1 & 3) != 0) ||
       ((iVar6 = 0x1f, (uVar1 * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar1 * 0x40000000) < 0x28f5c29 &&
        ((int)uVar1 % 400 != 0)))) {
      iVar6 = 0x1e;
    }
    iVar11 = uVar10 - 0x4f;
    iVar12 = iVar12 + iVar6 + 0xff;
  }
  else {
    if (((uVar10 & 3) != 0) ||
       ((iVar6 = 0x1f, (uVar10 * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar10 * 0x40000000) < 0x28f5c29 &&
        (uVar10 != ((int)uVar10 / 400) * 400)))) {
      iVar6 = 0x1e;
    }
    iVar11 = uVar10 - 0x4e;
    iVar12 = iVar12 + -0x50;
  }
  iVar7 = 0;
  iVar9 = iVar12 - iVar6;
  iVar8 = iVar12;
  if (iVar6 <= iVar12) {
    if (iVar9 < 0x9b) {
      uVar10 = (int)(short)iVar9 / 0x1f;
      dVar2 = uprv_floor_63((double)(uVar10 & 0xffff));
      iVar7 = (int)dVar2 + 1;
      iVar8 = (int)(short)((short)uVar10 * -0x1f + (short)iVar9);
    }
    else {
      uVar10 = (iVar9 - 0x9bU) / 0x1e;
      dVar2 = uprv_floor_63((double)uVar10);
      iVar7 = (int)dVar2 + 6;
      iVar8 = iVar9 + ((iVar9 - 0x9bU) / 0x1e) * 2 + uVar10 * -0x20 + -0x9b;
    }
  }
  (this->super_Calendar).fFields[0] = 0;
  (this->super_Calendar).fStamp[0] = 1;
  (this->super_Calendar).fIsSet[0] = '\x01';
  (this->super_Calendar).fFields[0x13] = iVar11;
  (this->super_Calendar).fStamp[0x13] = 1;
  (this->super_Calendar).fIsSet[0x13] = '\x01';
  (this->super_Calendar).fFields[1] = iVar11;
  (this->super_Calendar).fStamp[1] = 1;
  (this->super_Calendar).fStamp[2] = 1;
  (this->super_Calendar).fIsSet[1] = '\x01';
  (this->super_Calendar).fIsSet[2] = '\x01';
  (this->super_Calendar).fFields[2] = iVar7;
  (this->super_Calendar).fFields[5] = iVar8 + 1;
  (this->super_Calendar).fStamp[5] = 1;
  (this->super_Calendar).fStamp[6] = 1;
  (this->super_Calendar).fIsSet[5] = '\x01';
  (this->super_Calendar).fIsSet[6] = '\x01';
  (this->super_Calendar).fFields[6] = iVar12 + 1;
  return;
}

Assistant:

void IndianCalendar::handleComputeFields(int32_t julianDay, UErrorCode&  /* status */) {
    double jdAtStartOfGregYear;
    int32_t leapMonth, IndianYear, yday, IndianMonth, IndianDayOfMonth, mday;
    int32_t gregorianYear;      // Stores gregorian date corresponding to Julian day;
    int32_t gd[3];

    gregorianYear = jdToGregorian(julianDay, gd)[0];          // Gregorian date for Julian day
    IndianYear = gregorianYear - INDIAN_ERA_START;            // Year in Saka era
    jdAtStartOfGregYear = gregorianToJD(gregorianYear, 1, 1); // JD at start of Gregorian year
    yday = (int32_t)(julianDay - jdAtStartOfGregYear);        // Day number in Gregorian year (starting from 0)

    if (yday < INDIAN_YEAR_START) {
        // Day is at the end of the preceding Saka year
        IndianYear -= 1;
        leapMonth = isGregorianLeap(gregorianYear - 1) ? 31 : 30; // Days in leapMonth this year, previous Gregorian year
        yday += leapMonth + (31 * 5) + (30 * 3) + 10;
    } else {
        leapMonth = isGregorianLeap(gregorianYear) ? 31 : 30; // Days in leapMonth this year
        yday -= INDIAN_YEAR_START;
    }

    if (yday < leapMonth) {
        IndianMonth = 0;
        IndianDayOfMonth = yday + 1;
    } else {
        mday = yday - leapMonth;
        if (mday < (31 * 5)) {
            IndianMonth = (int32_t)uprv_floor(mday / 31) + 1;
            IndianDayOfMonth = (mday % 31) + 1;
        } else {
            mday -= 31 * 5;
            IndianMonth = (int32_t)uprv_floor(mday / 30) + 6;
            IndianDayOfMonth = (mday % 30) + 1;
        }
   }

   internalSet(UCAL_ERA, 0);
   internalSet(UCAL_EXTENDED_YEAR, IndianYear);
   internalSet(UCAL_YEAR, IndianYear);
   internalSet(UCAL_MONTH, IndianMonth);
   internalSet(UCAL_DAY_OF_MONTH, IndianDayOfMonth);
   internalSet(UCAL_DAY_OF_YEAR, yday + 1); // yday is 0-based
}